

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  ulong *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  long lVar10;
  char cVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  byte bVar16;
  uint uVar17;
  undefined1 *puVar18;
  int iVar19;
  int iVar20;
  byte *srcBuffer;
  int iVar21;
  ulong *puVar22;
  int iVar23;
  ulong uVar24;
  undefined1 *puVar25;
  int iVar26;
  undefined4 in_register_0000008c;
  ulong uVar27;
  ulong uVar28;
  undefined1 *puVar29;
  ulong uVar30;
  ulong *puVar31;
  ulong *puVar32;
  bool bVar33;
  uint local_12c;
  uint local_128;
  ulong local_120;
  ulong *local_118;
  ulong local_110;
  uint local_104;
  ulong *local_f8;
  ulong *local_e8;
  ulong *local_d8;
  undefined1 *local_d0;
  BIT_DStream_t local_c8;
  ulong local_a0;
  undefined1 *local_98;
  ulong *local_90;
  ulong *local_88;
  BitContainerType local_80;
  undefined1 *local_78;
  ulong local_70;
  size_t local_50;
  
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar15 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,dstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar15 != 0)) {
      return sVar15;
    }
    sVar15 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar15;
  }
  if (dstSize < 6 || cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar7 = *cSrc;
  uVar24 = (ulong)uVar7;
  uVar8 = *(ushort *)((long)cSrc + 2);
  uVar9 = *(ushort *)((long)cSrc + 4);
  uVar13 = uVar24 + uVar8 + (ulong)uVar9 + 6;
  if (cSrcSize < uVar13) {
    return 0xffffffffffffffec;
  }
  local_78 = (undefined1 *)(dstSize + (long)dst);
  uVar14 = dstSize + 3 >> 2;
  local_98 = (undefined1 *)(uVar14 + (long)dst);
  puVar2 = local_98 + uVar14;
  puVar3 = puVar2 + uVar14;
  if (local_78 < puVar3) {
    return 0xffffffffffffffec;
  }
  if (uVar7 == 0) {
    return 0xffffffffffffffb8;
  }
  local_88 = (ulong *)((long)cSrc + 6);
  local_90 = (ulong *)((long)cSrc + uVar24 + 6);
  local_70 = (ulong)*(ushort *)((long)DTable + 2);
  if (uVar7 < 8) {
    local_110 = (ulong)*(byte *)local_88;
    switch(uVar7) {
    case 2:
      goto LAB_003ab286;
    case 3:
      goto LAB_003ab27b;
    case 4:
      break;
    case 7:
      local_110 = local_110 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
    case 6:
      local_110 = local_110 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
    case 5:
      local_110 = local_110 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
      break;
    default:
      goto switchD_003ab229_default;
    }
    local_110 = local_110 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
LAB_003ab27b:
    local_110 = local_110 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
LAB_003ab286:
    local_110 = local_110 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
switchD_003ab229_default:
    bVar16 = *(byte *)((long)cSrc + uVar24 + 5);
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    local_104 = (uVar17 ^ 0x1f) + (uint)uVar7 * -8 + 0x29;
    local_d8 = local_88;
  }
  else {
    bVar16 = *(byte *)((long)cSrc + uVar24 + 5);
    if (bVar16 == 0) {
      return 0xffffffffffffffff;
    }
    local_110 = *(ulong *)((long)cSrc + (uVar24 - 2));
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    local_104 = ~uVar17 + 9;
    local_d8 = (ulong *)((long)cSrc + (uVar24 - 2));
  }
  if (uVar8 == 0) {
    return 0xffffffffffffffb8;
  }
  puVar22 = (ulong *)((ulong)uVar8 + (long)local_90);
  if (uVar8 < 8) {
    local_120 = (ulong)(byte)*local_90;
    switch(uVar8) {
    case 2:
      goto LAB_003ab3c2;
    case 3:
      goto LAB_003ab3b7;
    case 4:
      goto LAB_003ab3ac;
    case 5:
      goto LAB_003ab3a0;
    case 6:
      break;
    case 7:
      local_120 = local_120 | (ulong)*(byte *)((long)cSrc + uVar24 + 0xc) << 0x30;
      break;
    default:
      goto switchD_003ab345_default;
    }
    local_120 = local_120 + ((ulong)*(byte *)((long)cSrc + uVar24 + 0xb) << 0x28);
LAB_003ab3a0:
    local_120 = local_120 + ((ulong)*(byte *)((long)cSrc + uVar24 + 10) << 0x20);
LAB_003ab3ac:
    local_120 = local_120 + (ulong)*(byte *)((long)cSrc + uVar24 + 9) * 0x1000000;
LAB_003ab3b7:
    local_120 = local_120 + (ulong)*(byte *)((long)cSrc + uVar24 + 8) * 0x10000;
LAB_003ab3c2:
    local_120 = local_120 + (ulong)*(byte *)((long)cSrc + uVar24 + 7) * 0x100;
switchD_003ab345_default:
    bVar16 = *(byte *)((long)puVar22 + -1);
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    local_12c = (uVar17 ^ 0x1f) + (uint)uVar8 * -8 + 0x29;
    local_e8 = local_90;
  }
  else {
    bVar16 = *(byte *)((long)puVar22 + -1);
    if (bVar16 == 0) {
      return 0xffffffffffffffff;
    }
    local_120 = puVar22[-1];
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    local_12c = ~uVar17 + 9;
    local_e8 = puVar22 + -1;
  }
  if (uVar9 == 0) {
    return 0xffffffffffffffb8;
  }
  srcBuffer = (byte *)((ulong)uVar9 + (long)puVar22);
  if (uVar9 < 8) {
    local_a0 = (ulong)(byte)*puVar22;
    switch(uVar9) {
    case 7:
      local_a0 = local_a0 | (ulong)*(byte *)((long)puVar22 + 6) << 0x30;
    case 6:
      local_a0 = local_a0 + ((ulong)*(byte *)((long)puVar22 + 5) << 0x28);
    case 5:
      local_a0 = local_a0 + ((ulong)*(byte *)((long)puVar22 + 4) << 0x20);
    case 4:
      local_a0 = local_a0 + (ulong)*(byte *)((long)puVar22 + 3) * 0x1000000;
    case 3:
      local_a0 = local_a0 + (ulong)*(byte *)((long)puVar22 + 2) * 0x10000;
    case 2:
      local_a0 = local_a0 + (ulong)*(byte *)((long)puVar22 + 1) * 0x100;
    }
    bVar16 = srcBuffer[-1];
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    local_128 = (uVar17 ^ 0x1f) + (uint)uVar9 * -8 + 0x29;
    local_f8 = puVar22;
  }
  else {
    bVar16 = srcBuffer[-1];
    if (bVar16 == 0) {
      return 0xffffffffffffffff;
    }
    local_a0 = *(ulong *)(srcBuffer + -8);
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    local_128 = ~uVar17 + 9;
    local_f8 = (ulong *)(srcBuffer + -8);
  }
  local_50 = dstSize;
  sVar15 = BIT_initDStream(&local_c8,srcBuffer,cSrcSize - uVar13);
  if (0xffffffffffffff88 < sVar15) {
    return sVar15;
  }
  puVar18 = (undefined1 *)((long)dst + (local_50 - 3));
  puVar31 = (ulong *)((long)cSrc + 0xe);
  puVar32 = local_90 + 1;
  puVar1 = puVar22 + 1;
  cVar11 = (char)local_70;
  puVar25 = puVar2;
  puVar29 = local_98;
  local_d0 = puVar3;
  if (puVar3 < puVar18 && 7 < (ulong)((long)local_78 - (long)puVar3)) {
    local_80 = local_c8.bitContainer;
    bVar16 = -cVar11 & 0x3f;
    lVar10 = uVar14 * 3;
    do {
      puVar25 = (undefined1 *)dst;
      uVar13 = (local_110 << ((byte)local_104 & 0x3f)) >> bVar16;
      uVar24 = (local_120 << ((byte)local_12c & 0x3f)) >> bVar16;
      uVar27 = (local_a0 << ((byte)local_128 & 0x3f)) >> bVar16;
      iVar19 = *(byte *)((long)DTable + uVar13 * 2 + 4) + local_104;
      uVar28 = (local_80 << ((byte)local_c8.bitsConsumed & 0x3f)) >> bVar16;
      uVar30 = (local_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
      *puVar25 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar21 = *(byte *)((long)DTable + uVar24 * 2 + 4) + local_12c;
      puVar25[uVar14] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar23 = *(byte *)((long)DTable + uVar27 * 2 + 4) + local_128;
      puVar25[uVar14 * 2] = *(undefined1 *)((long)DTable + uVar27 * 2 + 5);
      iVar26 = *(byte *)((long)DTable + uVar28 * 2 + 4) + local_c8.bitsConsumed;
      puVar25[lVar10] = *(undefined1 *)((long)DTable + uVar28 * 2 + 5);
      uVar13 = (local_120 << ((byte)iVar21 & 0x3f)) >> bVar16;
      uVar27 = (local_a0 << ((byte)iVar23 & 0x3f)) >> bVar16;
      iVar19 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 4) + iVar19;
      uVar28 = (local_80 << ((byte)iVar26 & 0x3f)) >> bVar16;
      uVar24 = (local_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
      puVar25[1] = *(undefined1 *)((long)DTable + uVar30 * 2 + 5);
      iVar21 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar21;
      puVar25[uVar14 + 1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 4) + iVar23;
      puVar25[uVar14 * 2 + 1] = *(undefined1 *)((long)DTable + uVar27 * 2 + 5);
      iVar26 = (uint)*(byte *)((long)DTable + uVar28 * 2 + 4) + iVar26;
      puVar25[lVar10 + 1] = *(undefined1 *)((long)DTable + uVar28 * 2 + 5);
      iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
      puVar25[2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      uVar13 = (local_120 << ((byte)iVar21 & 0x3f)) >> bVar16;
      uVar24 = (local_a0 << ((byte)iVar23 & 0x3f)) >> bVar16;
      iVar21 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar21;
      uVar27 = (local_80 << ((byte)iVar26 & 0x3f)) >> bVar16;
      uVar28 = (local_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
      puVar25[uVar14 + 2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar23;
      puVar25[uVar14 * 2 + 2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar26 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 4) + iVar26;
      puVar25[lVar10 + 2] = *(undefined1 *)((long)DTable + uVar27 * 2 + 5);
      local_104 = (uint)*(byte *)((long)DTable + uVar28 * 2 + 4) + iVar19;
      puVar25[3] = *(undefined1 *)((long)DTable + uVar28 * 2 + 5);
      uVar13 = (local_120 << ((byte)iVar21 & 0x3f)) >> bVar16;
      bVar4 = *(byte *)((long)DTable + uVar13 * 2 + 4);
      puVar25[uVar14 + 3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      uVar13 = (local_a0 << ((byte)iVar23 & 0x3f)) >> bVar16;
      bVar5 = *(byte *)((long)DTable + uVar13 * 2 + 4);
      puVar25[uVar14 * 2 + 3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      uVar13 = (local_80 << ((byte)iVar26 & 0x3f)) >> bVar16;
      bVar6 = *(byte *)((long)DTable + uVar13 * 2 + 4);
      puVar25[lVar10 + 3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar19 = 3;
      if (local_d8 < puVar31) {
        iVar20 = 3;
      }
      else {
        local_d8 = (ulong *)((long)local_d8 - (ulong)(local_104 >> 3));
        local_104 = local_104 & 7;
        local_110 = *local_d8;
        iVar20 = 0;
      }
      local_12c = iVar21 + (uint)bVar4;
      if (puVar32 <= local_e8) {
        local_e8 = (ulong *)((long)local_e8 - (ulong)(local_12c >> 3));
        local_12c = local_12c & 7;
        local_120 = *local_e8;
        iVar19 = 0;
      }
      local_128 = iVar23 + (uint)bVar5;
      iVar23 = 3;
      if (local_f8 < puVar1) {
        iVar21 = 3;
      }
      else {
        local_f8 = (ulong *)((long)local_f8 - (ulong)(local_128 >> 3));
        local_128 = local_128 & 7;
        local_a0 = *local_f8;
        iVar21 = 0;
      }
      local_c8.bitsConsumed = iVar26 + (uint)bVar6;
      if (local_c8.limitPtr <= local_c8.ptr) {
        local_c8.ptr = (char *)((long)local_c8.ptr - (ulong)(local_c8.bitsConsumed >> 3));
        local_c8.bitsConsumed = local_c8.bitsConsumed & 7;
        local_c8.bitContainer = *(BitContainerType *)local_c8.ptr;
        iVar23 = 0;
        local_80 = local_c8.bitContainer;
      }
    } while ((puVar25 + lVar10 + 4 < puVar18) &&
            (dst = puVar25 + 4, ((iVar19 == 0 && iVar20 == 0) && iVar21 == 0) && iVar23 == 0));
    dst = puVar25 + 4;
    puVar25 = (undefined1 *)((long)dst + uVar14 * 2);
    puVar29 = (undefined1 *)((long)dst + uVar14);
    local_d0 = (undefined1 *)((long)dst + lVar10);
  }
  if ((local_98 < dst) || (puVar2 < puVar29)) {
    return 0xffffffffffffffec;
  }
  if (puVar3 < puVar25) {
    return 0xffffffffffffffec;
  }
  if ((long)local_98 - (long)dst < 4) {
    if (local_104 < 0x41) {
      if (local_d8 < puVar31) {
        if (local_d8 == local_88) {
          local_118 = local_88;
          puVar12 = local_118;
          goto LAB_003abbd6;
        }
        uVar17 = (int)local_d8 - (int)local_88;
        if (local_88 <= (ulong *)((long)local_d8 - (ulong)(local_104 >> 3))) {
          uVar17 = local_104 >> 3;
        }
        local_104 = local_104 + uVar17 * -8;
      }
      else {
        uVar17 = local_104 >> 3;
        local_104 = local_104 & 7;
      }
      local_110 = *(ulong *)((long)local_d8 - (ulong)uVar17);
      puVar12 = (ulong *)((long)local_d8 - (ulong)uVar17);
    }
    else {
      local_118 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      puVar12 = local_118;
    }
  }
  else {
    local_118 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    puVar12 = local_118;
    if (local_104 < 0x41) {
      bVar16 = -cVar11 & 0x3f;
      do {
        if (local_d8 < puVar31) {
          if (local_d8 == local_88) {
            local_118 = local_88;
            puVar12 = local_118;
            break;
          }
          bVar33 = local_88 <= (ulong *)((long)local_d8 - (ulong)(local_104 >> 3));
          uVar17 = (int)local_d8 - (int)local_88;
          if (bVar33) {
            uVar17 = local_104 >> 3;
          }
          local_104 = local_104 + uVar17 * -8;
        }
        else {
          uVar17 = local_104 >> 3;
          local_104 = local_104 & 7;
          bVar33 = true;
        }
        local_d8 = (ulong *)((long)local_d8 - (ulong)uVar17);
        local_110 = *local_d8;
        puVar12 = local_d8;
        if ((local_98 + -3 <= dst) || (!bVar33)) break;
        uVar13 = (local_110 << ((byte)local_104 & 0x3f)) >> bVar16;
        iVar19 = *(byte *)((long)DTable + uVar13 * 2 + 4) + local_104;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        uVar24 = (local_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
        uVar13 = (local_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
        iVar19 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar19;
        uVar24 = (local_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        local_104 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
        dst = (void *)((long)dst + 4);
        puVar12 = local_118;
        if (0x40 < local_104) break;
      } while( true );
    }
  }
LAB_003abbd6:
  local_118 = puVar12;
  if (dst < local_98) {
    do {
      uVar13 = (local_110 << ((byte)local_104 & 0x3f)) >> (-cVar11 & 0x3fU);
      local_104 = local_104 + *(byte *)((long)DTable + uVar13 * 2 + 4);
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < local_98);
  }
  if ((long)puVar2 - (long)puVar29 < 4) {
    if (local_12c < 0x41) {
      if (local_e8 < puVar32) {
        puVar31 = local_90;
        if (local_e8 == local_90) goto LAB_003abe02;
        uVar17 = (int)local_e8 - (int)local_90;
        if (local_90 <= (ulong *)((long)local_e8 - (ulong)(local_12c >> 3))) {
          uVar17 = local_12c >> 3;
        }
        local_12c = local_12c + uVar17 * -8;
      }
      else {
        uVar17 = local_12c >> 3;
        local_12c = local_12c & 7;
      }
      local_120 = *(ulong *)((long)local_e8 - (ulong)uVar17);
      puVar31 = (ulong *)((long)local_e8 - (ulong)uVar17);
    }
    else {
      puVar31 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    }
  }
  else {
    puVar31 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    if (local_12c < 0x41) {
      bVar16 = -cVar11 & 0x3f;
      do {
        if (local_e8 < puVar32) {
          puVar31 = local_90;
          if (local_e8 == local_90) break;
          bVar33 = local_90 <= (ulong *)((long)local_e8 - (ulong)(local_12c >> 3));
          uVar17 = (int)local_e8 - (int)local_90;
          if (bVar33) {
            uVar17 = local_12c >> 3;
          }
          local_12c = local_12c + uVar17 * -8;
        }
        else {
          uVar17 = local_12c >> 3;
          local_12c = local_12c & 7;
          bVar33 = true;
        }
        local_e8 = (ulong *)((long)local_e8 - (ulong)uVar17);
        local_120 = *local_e8;
        puVar31 = local_e8;
        if ((puVar2 + -3 <= puVar29) || (!bVar33)) break;
        uVar13 = (local_120 << ((byte)local_12c & 0x3f)) >> bVar16;
        iVar19 = *(byte *)((long)DTable + uVar13 * 2 + 4) + local_12c;
        *puVar29 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        uVar13 = (local_120 << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar19;
        uVar24 = (local_120 << ((byte)iVar19 & 0x3f)) >> bVar16;
        puVar29[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
        uVar13 = (local_120 << ((byte)iVar19 & 0x3f)) >> bVar16;
        puVar29[2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
        local_12c = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar19;
        puVar29[3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        puVar29 = puVar29 + 4;
        puVar31 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
        if (0x40 < local_12c) break;
      } while( true );
    }
  }
LAB_003abe02:
  if (puVar29 < puVar2) {
    do {
      uVar13 = (local_120 << ((byte)local_12c & 0x3f)) >> (-cVar11 & 0x3fU);
      local_12c = local_12c + *(byte *)((long)DTable + uVar13 * 2 + 4);
      *puVar29 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar29 = puVar29 + 1;
    } while (puVar29 < puVar2);
  }
  if ((long)puVar3 - (long)puVar25 < 4) {
    if (0x40 < local_128) goto LAB_003abf78;
    if (local_f8 < puVar1) {
      puVar32 = puVar22;
      if (local_f8 != puVar22) {
        uVar17 = (int)local_f8 - (int)puVar22;
        if (puVar22 <= (ulong *)((long)local_f8 - (ulong)(local_128 >> 3))) {
          uVar17 = local_128 >> 3;
        }
        local_128 = local_128 + uVar17 * -8;
        goto LAB_003abfe5;
      }
    }
    else {
      uVar17 = local_128 >> 3;
      local_128 = local_128 & 7;
LAB_003abfe5:
      local_a0 = *(ulong *)((long)local_f8 - (ulong)uVar17);
      puVar32 = (ulong *)((long)local_f8 - (ulong)uVar17);
    }
  }
  else {
    if (local_128 < 0x41) {
      bVar16 = -cVar11 & 0x3f;
      do {
        if (local_f8 < puVar1) {
          puVar32 = puVar22;
          if (local_f8 == puVar22) goto LAB_003abffb;
          bVar33 = puVar22 <= (ulong *)((long)local_f8 - (ulong)(local_128 >> 3));
          uVar17 = (int)local_f8 - (int)puVar22;
          if (bVar33) {
            uVar17 = local_128 >> 3;
          }
          local_128 = local_128 + uVar17 * -8;
        }
        else {
          uVar17 = local_128 >> 3;
          local_128 = local_128 & 7;
          bVar33 = true;
        }
        local_f8 = (ulong *)((long)local_f8 - (ulong)uVar17);
        local_a0 = *local_f8;
        puVar32 = local_f8;
        if ((puVar3 + -3 <= puVar25) || (!bVar33)) goto LAB_003abffb;
        uVar13 = (local_a0 << ((byte)local_128 & 0x3f)) >> bVar16;
        iVar19 = *(byte *)((long)DTable + uVar13 * 2 + 4) + local_128;
        *puVar25 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        uVar13 = (local_a0 << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar19;
        uVar24 = (local_a0 << ((byte)iVar19 & 0x3f)) >> bVar16;
        puVar25[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
        uVar13 = (local_a0 << ((byte)iVar19 & 0x3f)) >> bVar16;
        puVar25[2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
        local_128 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar19;
        puVar25[3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        puVar25 = puVar25 + 4;
      } while (local_128 < 0x41);
    }
LAB_003abf78:
    puVar32 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
LAB_003abffb:
  if (puVar25 < puVar3) {
    do {
      uVar13 = (local_a0 << ((byte)local_128 & 0x3f)) >> (-cVar11 & 0x3fU);
      local_128 = local_128 + *(byte *)((long)DTable + uVar13 * 2 + 4);
      *puVar25 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar25 = puVar25 + 1;
    } while (puVar25 < puVar3);
  }
  if ((long)local_78 - (long)local_d0 < 4) {
    if (local_c8.bitsConsumed < 0x41) {
      if (local_c8.ptr < local_c8.limitPtr) {
        if (local_c8.ptr == local_c8.start) goto LAB_003ac23c;
        uVar17 = (int)local_c8.ptr - (int)local_c8.start;
        if (local_c8.start <=
            (BitContainerType *)((long)local_c8.ptr - (ulong)(local_c8.bitsConsumed >> 3))) {
          uVar17 = local_c8.bitsConsumed >> 3;
        }
        local_c8.bitsConsumed = local_c8.bitsConsumed + uVar17 * -8;
      }
      else {
        uVar17 = local_c8.bitsConsumed >> 3;
        local_c8.bitsConsumed = local_c8.bitsConsumed & 7;
      }
      local_c8.ptr = (char *)((long)local_c8.ptr - (ulong)uVar17);
      local_c8.bitContainer = *(BitContainerType *)local_c8.ptr;
    }
    else {
      local_c8.ptr = "";
    }
  }
  else {
    if (local_c8.bitsConsumed < 0x41) {
      bVar16 = -cVar11 & 0x3f;
      do {
        if (local_c8.ptr < local_c8.limitPtr) {
          if (local_c8.ptr == local_c8.start) goto LAB_003ac23c;
          bVar33 = local_c8.start <=
                   (BitContainerType *)((long)local_c8.ptr - (ulong)(local_c8.bitsConsumed >> 3));
          uVar13 = (ulong)(uint)((int)local_c8.ptr - (int)local_c8.start);
          if (bVar33) {
            uVar13 = (ulong)(local_c8.bitsConsumed >> 3);
          }
          local_c8.bitsConsumed = local_c8.bitsConsumed + (int)uVar13 * -8;
        }
        else {
          uVar13 = (ulong)(local_c8.bitsConsumed >> 3);
          local_c8.bitsConsumed = local_c8.bitsConsumed & 7;
          bVar33 = true;
        }
        local_c8.ptr = (char *)((long)local_c8.ptr - uVar13);
        local_c8.bitContainer = *(BitContainerType *)local_c8.ptr;
        if ((puVar18 <= local_d0) || (!bVar33)) goto LAB_003ac23c;
        uVar13 = (local_c8.bitContainer << ((byte)local_c8.bitsConsumed & 0x3f)) >> bVar16;
        iVar19 = *(byte *)((long)DTable + uVar13 * 2 + 4) + local_c8.bitsConsumed;
        *local_d0 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        uVar13 = (local_c8.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar19;
        local_d0[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        uVar13 = (local_c8.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar19;
        local_d0[2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        uVar13 = (local_c8.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        local_c8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar19;
        local_d0[3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
        local_d0 = local_d0 + 4;
      } while (local_c8.bitsConsumed < 0x41);
    }
    local_c8.ptr = "";
  }
LAB_003ac23c:
  if (local_d0 < local_78) {
    do {
      uVar13 = (local_c8.bitContainer << ((byte)local_c8.bitsConsumed & 0x3f)) >> (-cVar11 & 0x3fU);
      local_c8.bitsConsumed = *(byte *)((long)DTable + uVar13 * 2 + 4) + local_c8.bitsConsumed;
      *local_d0 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      local_d0 = local_d0 + 1;
    } while (local_d0 < local_78);
  }
  if (local_c8.bitsConsumed != 0x40) {
    local_50 = 0xffffffffffffffec;
  }
  if (local_c8.ptr != local_c8.start) {
    local_50 = 0xffffffffffffffec;
  }
  if (local_128 != 0x40) {
    local_50 = 0xffffffffffffffec;
  }
  if (puVar32 != puVar22) {
    local_50 = 0xffffffffffffffec;
  }
  if (local_12c != 0x40) {
    local_50 = 0xffffffffffffffec;
  }
  if (puVar31 != local_90) {
    local_50 = 0xffffffffffffffec;
  }
  if (local_104 != 0x40) {
    local_50 = 0xffffffffffffffec;
  }
  if (local_118 != local_88) {
    local_50 = 0xffffffffffffffec;
  }
  return local_50;
}

Assistant:

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif
    if (HUF_ENABLE_FAST_DECODE && !(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}